

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

void __thiscall asmjit::ConstPool::reset(ConstPool *this,Zone *zone)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  Gap **ppGVar4;
  
  this->_zone = zone;
  lVar2 = 1;
  lVar3 = -0x90;
  ppGVar4 = this->_gaps;
  do {
    puVar1 = (undefined8 *)((long)this->_gaps + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(long *)((long)this->_gaps + lVar3 + 0x10) = lVar2;
    *ppGVar4 = (Gap *)0x0;
    lVar2 = lVar2 * 2;
    ppGVar4 = ppGVar4 + 1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0);
  this->_gapPool = (Gap *)0x0;
  this->_size = 0;
  this->_alignment = 0;
  return;
}

Assistant:

void ConstPool::reset(Zone* zone) noexcept {
  _zone = zone;

  size_t dataSize = 1;
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].reset();
    _tree[i].setDataSize(dataSize);
    _gaps[i] = nullptr;
    dataSize <<= 1;
  }

  _gapPool = nullptr;
  _size = 0;
  _alignment = 0;
}